

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

int __thiscall Fl_Tree_Item::remove_child(Fl_Tree_Item *this,Fl_Tree_Item *item)

{
  Fl_Tree_Item **ppFVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar3 = (ulong)(this->_children)._total;
  bVar6 = (long)uVar3 < 1;
  if (0 < (long)uVar3) {
    ppFVar1 = (this->_children)._items;
    if (*ppFVar1 == item) {
      uVar5 = 0;
    }
    else {
      uVar4 = 0;
      do {
        if (uVar3 - 1 == uVar4) {
          bVar6 = uVar3 <= uVar4 + 1;
          goto LAB_001dadb1;
        }
        uVar5 = uVar4 + 1;
        lVar2 = uVar4 + 1;
        uVar4 = uVar5;
      } while (ppFVar1[lVar2] != item);
      bVar6 = uVar3 <= uVar5;
    }
    Fl_Tree_Item_Array::clear(&item->_children);
    Fl_Tree_Item_Array::remove(&this->_children,(char *)(uVar5 & 0xffffffff));
  }
LAB_001dadb1:
  return -(uint)bVar6;
}

Assistant:

int Fl_Tree_Item::remove_child(Fl_Tree_Item *item) {
  for ( int t=0; t<children(); t++ ) {
    if ( child(t) == item ) {
      item->clear_children();
      _children.remove(t);
      recalc_tree();		// may change tree geometry
      return(0);
    }
  }
  return(-1);
}